

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

void QGuiApplicationPrivate::processCloseEvent(CloseEvent *e)

{
  Data *pDVar1;
  long lVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [12];
  bool bStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (e->window).wp.d;
  if (((pDVar1 != (Data *)0x0) && ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && (pQVar3 = (e->window).wp.value, pQVar3 != (QObject *)0x0)) {
    lVar2 = *(long *)(pQVar3 + 8);
    if ((*(char *)(lVar2 + 0x13c) == '\x01') && (*(char *)(lVar2 + 0x93) == '\0')) {
      (e->super_WindowSystemEvent).eventAccepted = false;
    }
    else {
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffe0 = &DAT_aaaaaaaaaaaaaaaa;
      QCloseEvent::QCloseEvent((QCloseEvent *)local_28);
      pDVar1 = (e->window).wp.d;
      if ((pDVar1 == (Data *)0x0) ||
         ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (e->window).wp.value;
      }
      QCoreApplication::sendSpontaneousEvent(pQVar3,(QEvent *)local_28);
      (e->super_WindowSystemEvent).eventAccepted = bStack_1c;
      QCloseEvent::~QCloseEvent((QCloseEvent *)local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processCloseEvent(QWindowSystemInterfacePrivate::CloseEvent *e)
{
    if (e->window.isNull())
        return;
    if (e->window.data()->d_func()->blockedByModalWindow && !e->window.data()->d_func()->inClose) {
        // a modal window is blocking this window, don't allow close events through, unless they
        // originate from a call to QWindow::close.
        e->eventAccepted = false;
        return;
    }

    QCloseEvent event;
    QGuiApplication::sendSpontaneousEvent(e->window.data(), &event);

    e->eventAccepted = event.isAccepted();
}